

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

CFG * __thiscall
covenant::CycleBreaking<covenant::Sym>::Approximate(CycleBreaking<covenant::Sym> *this,CFG *g)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  CFGConnect *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  uint j;
  set<int,_std::less<int>,_std::allocator<int>_> group_set;
  vector<int,_std::allocator<int>_> group;
  uint i;
  CFGConnect conn;
  int in_stack_fffffffffffffeac;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  uint uVar6;
  CFGConnect *this_00;
  undefined1 in_stack_fffffffffffffef8;
  undefined7 in_stack_fffffffffffffef9;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  CFG *in_stack_ffffffffffffff20;
  CycleBreaking<covenant::Sym> *in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> local_c8;
  uint local_b0;
  
  this_00 = in_RDI;
  CFGConnect::CFGConnect((CFGConnect *)in_stack_fffffffffffffeb0._M_node);
  CFGConnect::scc(this_00,(CFG *)in_RDI);
  local_b0 = 0;
  while( true ) {
    uVar6 = local_b0;
    uVar2 = CFGConnect::nGroups((CFGConnect *)0x232074);
    if (uVar2 <= uVar6) break;
    CFGConnect::group((CFGConnect *)in_stack_fffffffffffffeb0._M_node,in_stack_fffffffffffffeac);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (vector<int,_std::allocator<int>_> *)
               CONCAT71(in_stack_fffffffffffffef9,in_stack_fffffffffffffef8));
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2320b2);
    in_stack_ffffffffffffff04 = 0;
    while( true ) {
      uVar3 = (ulong)in_stack_ffffffffffffff04;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_c8);
      if (sVar4 <= uVar3) break;
      std::vector<int,_std::allocator<int>_>::operator[](&local_c8,(ulong)in_stack_ffffffffffffff04)
      ;
      pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00,&in_RDI->index);
      in_stack_fffffffffffffeb0 = pVar5.first._M_node;
      in_stack_fffffffffffffef8 = pVar5.second;
      in_stack_fffffffffffffeac =
           CONCAT13(in_stack_fffffffffffffef8,(int3)in_stack_fffffffffffffeac);
      in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1;
    }
    bVar1 = isLinearSCC(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    in_stack_fffffffffffffeac =
         CONCAT13((char)((uint)in_stack_fffffffffffffeac >> 0x18),
                  CONCAT12(bVar1,(short)in_stack_fffffffffffffeac));
    if (!bVar1) {
      cycle_breaking_transf
                ((CycleBreaking<covenant::Sym> *)
                 group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                 (CFG *)group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (vector<int,_std::allocator<int>_> *)
                 group_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)
                 group_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2321ca);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar6,in_stack_fffffffffffffec0));
    local_b0 = local_b0 + 1;
  }
  CFG::CFG((CFG *)this_00,(CFG *)in_RDI);
  CFGConnect::~CFGConnect((CFGConnect *)in_stack_fffffffffffffeb0._M_node);
  return (CFG *)this_00;
}

Assistant:

CFG Approximate(CFG g)
  {
    CFGConnect conn;
    conn.scc(g);
    // cout << "Mutually recursive groups in the grammar: " << conn << endl;
    for (unsigned int i=0; i < conn.nGroups(); i++)
    {
      vector<int>  group = conn.group(i);
      // For efficient membership queries
      set<int>     group_set;
      for(unsigned j=0; j<group.size(); j++)
        group_set.insert(group[j]);
        
      if (!isLinearSCC(g, group, group_set)) 
        cycle_breaking_transf(g, group, group_set);
    }
    return g;
  }